

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseData.cpp
# Opt level: O0

void __thiscall
SGParser::Generator::StdGrammarParseData::CreateLexemes
          (StdGrammarParseData *this,
          vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_> *lexemes)

{
  char *pcVar1;
  reference this_00;
  uint local_b4;
  allocator<char> local_81;
  String local_80;
  allocator<char> local_49;
  String local_48;
  ulong local_28;
  size_t i;
  vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_> *pvStack_18;
  uint idCount;
  vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_> *lexemes_local;
  StdGrammarParseData *this_local;
  
  i._4_4_ = 2;
  pvStack_18 = lexemes;
  lexemes_local = (vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_> *)this;
  std::vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>::resize(lexemes,0x24);
  for (local_28 = 0; local_28 < 0x24; local_28 = local_28 + 1) {
    this_00 = std::vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>::operator[]
                        (pvStack_18,local_28);
    pcVar1 = CreateLexemes::init[local_28].Name;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,pcVar1,&local_49);
    pcVar1 = CreateLexemes::init[local_28].RegulaRegExpr;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar1,&local_81);
    if (*CreateLexemes::init[local_28].Name == '\0') {
      local_b4 = 0;
    }
    else {
      local_b4 = i._4_4_;
    }
    Lexeme::SetLexeme(this_00,&local_48,&local_80,local_b4);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
    if (*CreateLexemes::init[local_28].Name != '\0') {
      i._4_4_ = i._4_4_ + 1;
    }
  }
  return;
}

Assistant:

void StdGrammarParseData::CreateLexemes(std::vector<Lexeme>& lexemes) {
    // Create the hard-coded internal lexemes structure
    static constexpr size_t LexemeCount = 36u;
    static constexpr struct LexemeInit {
        const char* Name;
        const char* RegulaRegExpr;
    } init[LexemeCount]=
    {
      {"bad_char",         "[^ \r\n\t]"              },
      {"",                 "[ \t\r\n]+"              }, // whitespace
      {"number_int",       "[0-9]+"                  },
      {"string_cons",      "\"[^\"]*\""              },
      {"identifier",       "[A-Za-z_][A-Za-z0-9_]*"  },
      {"",                 "\\/\\/.*"                }, // single line comment
      {"macro",            "%macro"                  },

      {"expression",       "%expression"             },
      {"ignore",           "%ignore"                 },
      {"push",             "%push"                   },
      {"pop",              "%pop"                    },
      {"goto",             "%goto"                   },

      {"prec",             "%prec"                   },
      {"left",             "%left"                   },
      {"right",            "%right"                  },
      {"nonassoc",         "%nonassoc"               },

      {"production",       "%production"             },
      {"shifton",          "%shifton"                },
      {"reduceon",         "%reduceon"               },
      {"reduce",           "%reduce"                 },
      {"action",           "%action"                 },
      {"error",            "%error",                 },
      {"error_backtrack",  "%error_backtrack",       },

      {",",                ","                       },
      {";",                ";"                       },
      {"?",                "\\?"                     },
      {"&",                "\\&"                     },
      {"|",                "\\|"                     },
      {"{",                "\\{"                     },
      {"}",                "\\}"                     },
      {"(",                "\\("                     },
      {")",                "\\)"                     },
      {">",                ">"                       },
      {"->",               "\\-\\>"                  },
      {"quote_cons",       "\'((\'\')|[^\'\n\r])*\'" },

      // Expression from the web (old one did not seem to work):
      // /\*[^*]*\*+([^/*][^*]*\*+)*/
      {"",                 "\\/\\*[^\\*]*\\*+([^\\/\\*][^\\*]*\\*+)*\\/" }  // Multi-line comment
      // Improvements:
      // Ideally we have lazy loops (x*?): "/\\*.*?\\*/"
      // Second best, if we have possessive qualifiers (x*+):
      // "/\\*[^*]*+\\*++([^/][^*]*+\\*++)*+/"
      // Worst case, we can at least remove unnecessary backslashes:
      // "/\\*[^*]*\\*+([^/\\*][^*]*\\*+)*/"
    };

    unsigned idCount = TokenCode::TokenFirstID;
    lexemes.resize(LexemeCount);
    for (size_t i = 0u; i < LexemeCount; ++i) {
        lexemes[i].SetLexeme(init[i].Name, init[i].RegulaRegExpr, init[i].Name[0u] ? idCount : 0u);
        if (init[i].Name[0u])
            ++idCount;
    }
}